

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.h
# Opt level: O3

double __thiscall
hungarian_algorithm::HungarianSolver<double,unsigned_long,std::less<double>>::
getAssignment<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
          (HungarianSolver<double,unsigned_long,std::less<double>> *this,
          matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
          *cost_function,vector<unsigned_long,_std::allocator<unsigned_long>_> *assignment_map)

{
  ulong j;
  size_type i;
  const_reference pdVar1;
  size_type i_00;
  double local_40;
  value_type local_38;
  
  local_38 = *(value_type *)(this + 8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_fill_assign
            (assignment_map,*(size_type *)this,&local_38);
  local_40 = *(double *)(this + 0xe0);
  if (*(long *)this != 0) {
    i_00 = 0;
    do {
      j = hungarian_algorithm::HungarianSolverBase::findInRow((vector *)this,(ulong)(this + 0x88));
      if (j < *(ulong *)(this + 8)) {
        (assignment_map->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start[i_00] = j;
        i = boost::numeric::ublas::basic_row_major<unsigned_long,_long>::element
                      (i_00,cost_function->size1_,j,cost_function->size2_);
        pdVar1 = boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::operator[]
                           (&cost_function->data_,i);
        local_40 = local_40 + *pdVar1;
      }
      i_00 = i_00 + 1;
    } while (i_00 < *(ulong *)this);
  }
  return local_40;
}

Assistant:

Cost getAssignment(const CostFunction& cost_function, AssignmentMap& assignment_map)
  {
    // Fill assignment map and compute total cost of assignment:
    AssignmentMapAdapter<Size, AssignmentMap> assignment_map_adapter(assignment_map, num_rows_, num_cols_);
    Cost total_cost(zero_cost_);
    for (std::size_t row = 0; row < num_rows_; ++row)
    {
      const std::size_t col(findInRow(star_matrix_, row));
      if (col < num_cols_)
      {
        assignment_map_adapter.insert(Size(row), Size(col));
        total_cost += cost_function(Size(row), Size(col));
      }
    }
    return total_cost;
  }